

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O0

void uxsel_set(int fd,int rwx,uxsel_callback_fn callback)

{
  int *e;
  uxsel_id *puVar1;
  fd *newfd;
  uxsel_callback_fn callback_local;
  int rwx_local;
  int fd_local;
  
  if (-1 < fd) {
    uxsel_del(fd);
    if (rwx != 0) {
      e = (int *)safemalloc(1,0x18,0);
      *e = fd;
      e[1] = rwx;
      *(uxsel_callback_fn *)(e + 2) = callback;
      puVar1 = uxsel_input_add(fd,rwx);
      *(uxsel_id **)(e + 4) = puVar1;
      add234(fds,e);
    }
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/uxsel.c",
                0x43,"void uxsel_set(int, int, uxsel_callback_fn)");
}

Assistant:

void uxsel_set(int fd, int rwx, uxsel_callback_fn callback)
{
    struct fd *newfd;

    assert(fd >= 0);

    uxsel_del(fd);

    if (rwx) {
        newfd = snew(struct fd);
        newfd->fd = fd;
        newfd->rwx = rwx;
        newfd->callback = callback;
        newfd->id = uxsel_input_add(fd, rwx);
        add234(fds, newfd);
    }
}